

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int unit_addrs_compare(void *v1,void *v2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  if (*v1 < *v2) {
    return -1;
  }
  iVar3 = 1;
  if (*v1 <= *v2) {
    if (*(ulong *)((long)v2 + 8) <= *(ulong *)((long)v1 + 8)) {
      if (*(ulong *)((long)v2 + 8) < *(ulong *)((long)v1 + 8)) {
        return -1;
      }
      lVar1 = *(long *)(*(long *)((long)v2 + 0x10) + 0x38);
      iVar3 = -1;
      lVar2 = *(long *)(*(long *)((long)v1 + 0x10) + 0x38);
      if (lVar1 <= lVar2) {
        return (int)(lVar1 < lVar2);
      }
    }
  }
  return iVar3;
}

Assistant:

static int
unit_addrs_compare (const void *v1, const void *v2)
{
  const struct unit_addrs *a1 = (const struct unit_addrs *) v1;
  const struct unit_addrs *a2 = (const struct unit_addrs *) v2;

  if (a1->low < a2->low)
    return -1;
  if (a1->low > a2->low)
    return 1;
  if (a1->high < a2->high)
    return 1;
  if (a1->high > a2->high)
    return -1;
  if (a1->u->lineoff < a2->u->lineoff)
    return -1;
  if (a1->u->lineoff > a2->u->lineoff)
    return 1;
  return 0;
}